

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

opj_bool tcd_t2_decode(opj_tcd_v2_t *p_tcd,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                      OPJ_UINT32 p_max_src_size,opj_codestream_index_t *p_cstr_index)

{
  opj_bool oVar1;
  opj_t2_v2_t *p_t2;
  uint uVar2;
  
  p_t2 = t2_create_v2(p_tcd->image,p_tcd->cp);
  if (p_t2 == (opj_t2_v2_t *)0x0) {
    uVar2 = 0;
  }
  else {
    oVar1 = t2_decode_packets_v2
                      (p_t2,p_tcd->tcd_tileno,p_tcd->tcd_image->tiles,p_src_data,p_data_read,
                       p_max_src_size,p_cstr_index);
    uVar2 = (uint)(oVar1 != 0);
    t2_destroy_v2(p_t2);
  }
  return uVar2;
}

Assistant:

opj_bool tcd_t2_decode (
					opj_tcd_v2_t *p_tcd,
					OPJ_BYTE * p_src_data,
					OPJ_UINT32 * p_data_read,
					OPJ_UINT32 p_max_src_size,
					opj_codestream_index_t *p_cstr_index
					)
{
	opj_t2_v2_t * l_t2;

	l_t2 = t2_create_v2(p_tcd->image, p_tcd->cp);
	if (l_t2 == 00) {
		return OPJ_FALSE;
	}

	if (! t2_decode_packets_v2(
					l_t2,
					p_tcd->tcd_tileno,
					p_tcd->tcd_image->tiles,
					p_src_data,
					p_data_read,
					p_max_src_size,
					p_cstr_index)) {
		t2_destroy_v2(l_t2);
		return OPJ_FALSE;
	}

	t2_destroy_v2(l_t2);

	/*---------------CLEAN-------------------*/
	return OPJ_TRUE;
}